

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directory.cpp
# Opt level: O3

ssize_t __thiscall directory::write(directory *this,int __fd,void *__buf,size_t __n)

{
  ulong uVar1;
  char *pcVar2;
  undefined4 in_register_00000034;
  ulong uVar3;
  long lVar4;
  
  pcVar2 = (char *)(CONCAT44(in_register_00000034,__fd) + 0x10);
  std::ostream::seekp(pcVar2,0,0);
  std::ostream::write(pcVar2,(long)this);
  uVar1 = std::ostream::write(pcVar2,(long)&this->bucket_size);
  if (this->bucket_size != 0) {
    lVar4 = 0;
    uVar3 = 0;
    do {
      std::ostream::write(pcVar2,(long)(this->bucket_ids).
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start + lVar4);
      uVar3 = uVar3 + 1;
      uVar1 = (ulong)this->bucket_size;
      lVar4 = lVar4 + 4;
    } while (uVar3 < uVar1);
  }
  return uVar1;
}

Assistant:

void directory::write(std::fstream &stream) const {
    stream.seekp(0);

    stream.write((char *) &depth, DEPTHS);
    stream.write((char *) &bucket_size, BUCKET_SIZE);

    for (int i = 0; i < bucket_size; ++i) {
        stream.write((char *) &bucket_ids[i], BUCKET_ID);
    }
}